

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_resampler.cc
# Opt level: O3

int webrtc::WebRtcAec_GetSkew(void *resampInst,int rawSkew,float *skewEst)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  iVar5 = *(int *)((long)resampInst + 0xb48);
  if ((long)iVar5 < 400) {
    *(int *)((long)resampInst + (long)iVar5 * 4 + 0x508) = rawSkew;
    *(int *)((long)resampInst + 0xb48) = *(int *)((long)resampInst + 0xb48) + 1;
    return 0;
  }
  if (iVar5 != 400) {
    *skewEst = *(float *)((long)resampInst + 0xb4c);
    return 0;
  }
  iVar5 = *(int *)((long)resampInst + 0x504);
  iVar6 = (int)((float)iVar5 * 0.04);
  *skewEst = 0.0;
  iVar7 = -iVar6;
  lVar4 = 0;
  fVar10 = 0.0;
  iVar8 = 0;
  do {
    iVar3 = *(int *)((long)resampInst + lVar4 * 4 + 0x508);
    bVar2 = SBORROW4(iVar3,iVar7) == iVar3 + iVar6 < 0;
    if ((iVar3 != iVar7 && bVar2) && iVar3 < iVar6) {
      fVar10 = fVar10 + (float)iVar3;
    }
    iVar8 = iVar8 + (uint)((iVar3 != iVar7 && bVar2) && iVar3 < iVar6);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 400);
  iVar3 = -1;
  if (iVar8 != 0) {
    iVar5 = (int)((float)iVar5 * 0.0025);
    fVar10 = fVar10 / (float)iVar8;
    fVar11 = 0.0;
    lVar4 = 0;
    do {
      iVar1 = *(int *)((long)resampInst + lVar4 * 4 + 0x508);
      if ((iVar1 < iVar6) && (iVar1 != iVar7 && SBORROW4(iVar1,iVar7) == iVar1 + iVar6 < 0)) {
        fVar15 = (float)iVar1 - fVar10;
        uVar9 = -(uint)(-fVar15 <= fVar15);
        fVar11 = fVar11 + (float)(~uVar9 & (uint)-fVar15 | (uint)fVar15 & uVar9);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 400);
    fVar11 = fVar11 / (float)iVar8;
    lVar4 = 0;
    fVar15 = 0.0;
    fVar13 = 0.0;
    fVar14 = 0.0;
    fVar12 = 0.0;
    fVar16 = 0.0;
    iVar6 = 0;
    do {
      iVar7 = *(int *)((long)resampInst + lVar4 * 4 + 0x508);
      if (((iVar7 < iVar5) && (iVar7 != -iVar5 && SBORROW4(iVar7,-iVar5) == iVar7 + iVar5 < 0)) ||
         ((iVar7 < (int)(fVar11 * 5.0 + fVar10 + 1.0) &&
          ((int)(fVar11 * -5.0 + fVar10 + -1.0) < iVar7)))) {
        iVar6 = iVar6 + 1;
        fVar16 = fVar16 + (float)iVar7;
        fVar12 = fVar12 + (float)iVar6;
        fVar14 = fVar14 + (float)(iVar6 * iVar6);
        fVar13 = fVar13 + fVar16;
        fVar15 = fVar15 + (float)iVar6 * fVar16;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 400);
    if (iVar6 != 0) {
      if (iVar6 < 1) {
        __assert_fail("n > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/aec/aec_resampler.cc"
                      ,0xc4,"int webrtc::EstimateSkew(const int *, int, int, float *)");
      }
      fVar14 = fVar12 * (-fVar12 / (float)iVar6) + fVar14;
      fVar10 = (float)(-(uint)(fVar14 != 0.0) &
                      (uint)(((-fVar12 / (float)iVar6) * fVar13 + fVar15) / fVar14));
      *skewEst = fVar10;
      iVar3 = 0;
      goto LAB_0016738b;
    }
  }
  fVar10 = 0.0;
LAB_0016738b:
  *(float *)((long)resampInst + 0xb4c) = fVar10;
  *(undefined4 *)((long)resampInst + 0xb48) = 0x191;
  return iVar3;
}

Assistant:

int WebRtcAec_GetSkew(void* resampInst, int rawSkew, float* skewEst) {
  AecResampler* obj = static_cast<AecResampler*>(resampInst);
  int err = 0;

  if (obj->skewDataIndex < kEstimateLengthFrames) {
    obj->skewData[obj->skewDataIndex] = rawSkew;
    obj->skewDataIndex++;
  } else if (obj->skewDataIndex == kEstimateLengthFrames) {
    err = EstimateSkew(obj->skewData, kEstimateLengthFrames,
                       obj->deviceSampleRateHz, skewEst);
    obj->skewEstimate = *skewEst;
    obj->skewDataIndex++;
  } else {
    *skewEst = obj->skewEstimate;
  }

  return err;
}